

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

void overview_scan(level *lev,overview_info *oi)

{
  char cVar1;
  trap *ptVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char local_78 [40];
  boolean seen_shop [80];
  
  seen_shop[0x18] = '\0';
  seen_shop[0x19] = '\0';
  seen_shop[0x1a] = '\0';
  seen_shop[0x1b] = '\0';
  seen_shop[0x1c] = '\0';
  seen_shop[0x1d] = '\0';
  seen_shop[0x1e] = '\0';
  seen_shop[0x1f] = '\0';
  seen_shop[0x20] = '\0';
  seen_shop[0x21] = '\0';
  seen_shop[0x22] = '\0';
  seen_shop[0x23] = '\0';
  seen_shop[0x24] = '\0';
  seen_shop[0x25] = '\0';
  seen_shop[0x26] = '\0';
  seen_shop[0x27] = '\0';
  seen_shop[8] = '\0';
  seen_shop[9] = '\0';
  seen_shop[10] = '\0';
  seen_shop[0xb] = '\0';
  seen_shop[0xc] = '\0';
  seen_shop[0xd] = '\0';
  seen_shop[0xe] = '\0';
  seen_shop[0xf] = '\0';
  seen_shop[0x10] = '\0';
  seen_shop[0x11] = '\0';
  seen_shop[0x12] = '\0';
  seen_shop[0x13] = '\0';
  seen_shop[0x14] = '\0';
  seen_shop[0x15] = '\0';
  seen_shop[0x16] = '\0';
  seen_shop[0x17] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  seen_shop[0] = '\0';
  seen_shop[1] = '\0';
  seen_shop[2] = '\0';
  seen_shop[3] = '\0';
  seen_shop[4] = '\0';
  seen_shop[5] = '\0';
  seen_shop[6] = '\0';
  seen_shop[7] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  oi->fountains = '\0';
  oi->magic_chests = '\0';
  oi->sinks = '\0';
  oi->thrones = '\0';
  oi->trees = '\0';
  oi->temples = '\0';
  oi->altars = '\0';
  oi->altaralign = '\0';
  oi->shopcount = '\0';
  oi->shoptype = '\0';
  oi->branch = '\0';
  oi->portal = '\0';
  (oi->branch_dst).dnum = '\0';
  (oi->branch_dst).dlevel = '\0';
  (oi->portal_dst).dnum = '\0';
  (oi->portal_dst).dlevel = '\0';
  oi->branch_dst_known = '\0';
  oi->portal_dst_known = '\0';
  if (lev != (level *)0x0) {
    pbVar4 = &lev->locations[0][0].field_0x6;
    uVar5 = 0;
    do {
      uVar6 = 0;
      pbVar3 = pbVar4;
      do {
        if (pbVar3[-1] != 0) {
          switch(*(uint *)(pbVar3 + -6) & 0x3f) {
          case 0xf:
            uVar7 = *(ushort *)(pbVar3 + 2) & 0x3f;
            if ((((2 < uVar7) &&
                 (((lev->z).dnum != dungeon_topology.d_blackmarket_level.dnum ||
                  ((lev->z).dlevel != dungeon_topology.d_blackmarket_level.dlevel)))) &&
                (cVar1 = lev->rooms[uVar7 - 3].rtype, '\x11' < cVar1)) && (local_78[uVar7] == '\0'))
            {
              local_78[uVar7] = '\x01';
              if (oi->shopcount == '\0') {
                oi->shoptype = cVar1 + -0x12;
              }
              else {
                oi->shoptype = -1;
              }
              oi->shopcount = oi->shopcount + '\x01';
            }
            break;
          case 0x1e:
            oi->trees = oi->trees + '\x01';
            break;
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
            if (((uVar6 == (uint)(int)(lev->sstairs).sx) && (uVar5 == (uint)(int)(lev->sstairs).sy))
               && (cVar1 = (lev->sstairs).tolev.dnum, cVar1 != (lev->z).dnum)) {
              oi->branch = '\x01';
              if (levels[(char)((lev->sstairs).tolev.dlevel + (char)dungeons[cVar1].ledger_start)]
                  == (level *)0x0) {
                oi->branch_dst_known = '\0';
              }
              else {
                oi->branch_dst_known = '\x01';
                oi->branch_dst = (lev->sstairs).tolev;
              }
            }
            break;
          case 0x26:
            oi->altars = oi->altars + '\x01';
            oi->altaralign = oi->altaralign | *pbVar3 >> 4 & 7;
            if ((2 < (*(ushort *)(pbVar3 + 2) & 0x3f)) &&
               (lev->rooms[(*(ushort *)(pbVar3 + 2) & 0x3f) - 3].rtype == '\n')) {
              oi->temples = oi->temples + '\x01';
            }
            break;
          case 0x28:
            oi->thrones = oi->thrones + '\x01';
            break;
          case 0x29:
            oi->magic_chests = oi->magic_chests + '\x01';
            break;
          case 0x2a:
            oi->sinks = oi->sinks + '\x01';
            break;
          case 0x2b:
            oi->fountains = oi->fountains + '\x01';
          }
        }
        uVar6 = uVar6 + 1;
        pbVar3 = pbVar3 + 0xfc;
      } while (uVar6 != 0x50);
      uVar5 = uVar5 + 1;
      pbVar4 = pbVar4 + 0xc;
    } while (uVar5 != 0x15);
    for (ptVar2 = lev->lev_traps; ptVar2 != (trap *)0x0; ptVar2 = ptVar2->ntrap) {
      if ((ptVar2->field_0x8 & 0x3f) == 0x32) {
        oi->portal = '\x01';
        if (levels[(char)((ptVar2->dst).dlevel + (char)dungeons[(ptVar2->dst).dnum].ledger_start)]
            == (level *)0x0) {
          oi->portal_dst_known = '\0';
        }
        else {
          oi->portal_dst_known = '\x01';
          oi->portal_dst = ptVar2->dst;
        }
      }
    }
  }
  return;
}

Assistant:

static void overview_scan(const struct level *lev, struct overview_info *oi)
{
	int x, y, rnum, rtyp;
	struct trap *trap;
	boolean seen_shop[MAXNROFROOMS * 2];
	
	memset(seen_shop, 0, sizeof(seen_shop));
	memset(oi, 0, sizeof(struct overview_info));
	if (!lev)
	    return;
	
	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		if (!lev->locations[x][y].seenv)
		    continue;
		
		switch (lev->locations[x][y].mem_bg) {
		    case S_upstair: case S_dnstair:
		    case S_upladder: case S_dnladder:
		    case S_upsstair: case S_dnsstair:
			if (lev->sstairs.sx == x && lev->sstairs.sy == y &&
			    lev->sstairs.tolev.dnum != lev->z.dnum) {
			    oi->branch = TRUE;
			    if (levels[ledger_no(&lev->sstairs.tolev)]) {
				oi->branch_dst_known = TRUE;
				oi->branch_dst = lev->sstairs.tolev;
			    } else {
				oi->branch_dst_known = FALSE;
			    }
			}
			break;
		    
		    case S_fountain:
			oi->fountains++;
			break;
			
		    case S_sink:
			oi->sinks++;
			break;
			
		    case S_throne:
			oi->thrones++; /* don't care about throne rooms */
			break;

		    case S_magic_chest:
			oi->magic_chests++;
			break;

		    case S_altar:
			oi->altars++;
			oi->altaralign |= (lev->locations[x][y].altarmask & AM_MASK);
			rnum = lev->locations[x][y].roomno;
			if (rnum >= ROOMOFFSET &&
			    lev->rooms[rnum - ROOMOFFSET].rtype == TEMPLE)
			    oi->temples++;
			break;
			
		    case S_tree:
			oi->trees++;
			break;
			
		    case S_room:
			rnum = lev->locations[x][y].roomno;
			if (rnum < ROOMOFFSET)
			    break;
			
			/* Black Market implies the shop, so
			 * there's no need to record it here.
			 */
			if (Is_blackmarket(&lev->z))
			    break;
			
			rtyp = lev->rooms[rnum - ROOMOFFSET].rtype;
			if (rtyp >= SHOPBASE && !seen_shop[rnum]) {
			    seen_shop[rnum] = TRUE;
			    if (oi->shopcount == 0)
				oi->shoptype = rtyp - SHOPBASE;
			    else
				oi->shoptype = -1; /* multiple shops */
			    oi->shopcount++;
			}
		}
	    }
	}
	
	/* find the magic portal, if it exists */
	for (trap = lev->lev_traps; trap; trap = trap->ntrap) {
	    if (trap->tseen && trap->ttyp == MAGIC_PORTAL) {
		oi->portal = TRUE;
		if (levels[ledger_no(&trap->dst)]) {
		    oi->portal_dst_known = TRUE;
		    oi->portal_dst = trap->dst;
		} else {
		    oi->portal_dst_known = FALSE;
		}
	    }
	}
}